

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paex_ocean_shore.c
# Opt level: O1

float GeneratePinkNoise(PinkNoise *pink)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  
  uVar3 = pink->pink_Index + 1U & pink->pink_IndexMask;
  pink->pink_Index = uVar3;
  if (uVar3 != 0) {
    lVar2 = 0;
    uVar1 = uVar3 & 1;
    while (uVar1 == 0) {
      lVar2 = lVar2 + 1;
      uVar1 = uVar3 & 2;
      uVar3 = (int)uVar3 >> 1;
    }
    lVar4 = pink->pink_RunningSum - pink->pink_Rows[lVar2];
    pink->pink_RunningSum = lVar4;
    GenerateRandomNumber_randSeed = GenerateRandomNumber_randSeed * 0xbb38435 + 0x3619636b;
    lVar5 = GenerateRandomNumber_randSeed >> 0x28;
    pink->pink_RunningSum = lVar4 + lVar5;
    pink->pink_Rows[lVar2] = lVar5;
  }
  GenerateRandomNumber_randSeed = GenerateRandomNumber_randSeed * 0xbb38435 + 0x3619636b;
  return (float)((GenerateRandomNumber_randSeed >> 0x28) + pink->pink_RunningSum) *
         pink->pink_Scalar;
}

Assistant:

float GeneratePinkNoise( PinkNoise *pink )
{
    long newRandom;
    long sum;
    float output;
    /* Increment and mask index. */
    pink->pink_Index = (pink->pink_Index + 1) & pink->pink_IndexMask;
    /* If index is zero, don't update any random values. */
    if( pink->pink_Index != 0 )
    {
        /* Determine how many trailing zeros in PinkIndex. */
        /* This algorithm will hang if n==0 so test first. */
        int numZeros = 0;
        int n = pink->pink_Index;
        while( (n & 1) == 0 )
        {
            n = n >> 1;
            numZeros++;
        }
        /* Replace the indexed ROWS random value.
         * Subtract and add back to RunningSum instead of adding all the random
         * values together. Only one changes each time.
         */
        pink->pink_RunningSum -= pink->pink_Rows[numZeros];
        newRandom = ((long)GenerateRandomNumber()) >> PINK_RANDOM_SHIFT;
        pink->pink_RunningSum += newRandom;
        pink->pink_Rows[numZeros] = newRandom;
    }

    /* Add extra white noise value. */
    newRandom = ((long)GenerateRandomNumber()) >> PINK_RANDOM_SHIFT;
    sum = pink->pink_RunningSum + newRandom;
    /* Scale to range of -1.0 to 0.9999. */
    output = pink->pink_Scalar * sum;
    return output;
}